

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
server_task::get_list_id
          (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
           *__return_storage_ptr__,vector<server_task,_std::allocator<server_task>_> *tasks)

{
  pointer psVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  allocator_type local_2b;
  key_equal local_2a;
  hash<int> local_29;
  
  httplib::detail::std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&__return_storage_ptr__->_M_h,
               ((long)(tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
               (long)(tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
                     super__Vector_impl_data._M_start) / 0x758,&local_29,&local_2a,&local_2b);
  lVar2 = 0;
  for (uVar3 = 0;
      psVar1 = (tasks->super__Vector_base<server_task,_std::allocator<server_task>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(tasks->super__Vector_base<server_task,_std::allocator<server_task>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)psVar1) / 0x758);
      uVar3 = uVar3 + 1) {
    httplib::detail::std::__detail::
    _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)__return_storage_ptr__,(value_type *)((long)&psVar1->id + lVar2));
    lVar2 = lVar2 + 0x758;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::unordered_set<int> get_list_id(const std::vector<server_task> & tasks) {
        std::unordered_set<int> ids(tasks.size());
        for (size_t i = 0; i < tasks.size(); i++) {
            ids.insert(tasks[i].id);
        }
        return ids;
    }